

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorHandling.cpp
# Opt level: O1

void llvm::install_fatal_error_handler(fatal_error_handler_t handler,void *user_data)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&ErrorHandlerMutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if (ErrorHandler_abi_cxx11_ == (fatal_error_handler_t)0x0) {
    ErrorHandler_abi_cxx11_ = handler;
    ErrorHandlerUserData = user_data;
    pthread_mutex_unlock((pthread_mutex_t *)&ErrorHandlerMutex);
    return;
  }
  __assert_fail("!ErrorHandler && \"Error handler already registered!\\n\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ErrorHandling.cpp"
                ,0x45,"void llvm::install_fatal_error_handler(fatal_error_handler_t, void *)");
}

Assistant:

void llvm::install_fatal_error_handler(fatal_error_handler_t handler,
                                       void *user_data) {
#if LLVM_ENABLE_THREADS == 1
  std::lock_guard<std::mutex> Lock(ErrorHandlerMutex);
#endif
  assert(!ErrorHandler && "Error handler already registered!\n");
  ErrorHandler = handler;
  ErrorHandlerUserData = user_data;
}